

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidgetPrivate::_q_yearEditingFinished(QCalendarWidgetPrivate *this)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  QCoreApplication *pQVar4;
  QCalendarWidgetPrivate *this_00;
  QCalendarWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  int newYear;
  QCalendarWidget *q;
  size_t RuntimeThreshold;
  size_t i;
  QDate currentDate;
  undefined8 in_stack_fffffffffffffee8;
  FocusPolicy policy;
  QWidget *in_stack_fffffffffffffef0;
  QString *text;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int iVar5;
  QString *in_stack_ffffffffffffff08;
  QCalendarWidgetPrivate *in_stack_ffffffffffffff10;
  ulong local_a8;
  undefined8 local_80;
  undefined8 local_78;
  undefined1 local_60 [8];
  QDate in_stack_ffffffffffffffa8;
  QLocale local_18;
  undefined1 *local_10;
  long local_8;
  
  policy = (FocusPolicy)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QWidget::hide((QWidget *)0x51cfa9);
  QWidget::setFocusPolicy(in_stack_fffffffffffffef0,policy);
  pQVar4 = QCoreApplication::instance();
  QObject::removeEventFilter((QObject *)pQVar4);
  QSpacerItem::changeSize
            ((QSpacerItem *)in_RDI,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
             (Policy)((ulong)in_stack_fffffffffffffef0 >> 0x20),(Policy)in_stack_fffffffffffffef0);
  QWidget::show((QWidget *)in_RDI);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = (undefined1 *)getCurrentDate(in_stack_ffffffffffffff10);
  QWidget::locale((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  QAbstractSpinBox::text
            ((QAbstractSpinBox *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  iVar2 = QLocale::toInt((QLocale *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         (bool *)in_RDI);
  QString::~QString((QString *)0x51d075);
  QLocale::~QLocale(&local_18);
  iVar5 = iVar2;
  iVar3 = QDate::year(&local_10,*(undefined8 *)&in_RDI->m_model->m_calendar);
  local_10 = (undefined1 *)
             QDate::addYears(&local_10,iVar5 - iVar3,*(undefined8 *)&in_RDI->m_model->m_calendar);
  QWidget::locale((QWidget *)CONCAT44(iVar5,iVar2));
  puVar1 = local_10;
  this_00 = (QCalendarWidgetPrivate *)std::data<char16_t_const,5ul>((char16_t (*) [5])L"yyyy");
  for (local_a8 = 0; (local_a8 < 5 && (L"yyyy"[local_a8] != L'\0')); local_a8 = local_a8 + 1) {
  }
  QStringView::QStringView<char16_t,_true>
            ((QStringView *)in_RDI,(char16_t *)CONCAT44(iVar5,iVar2),
             (qsizetype)in_stack_fffffffffffffef0);
  text = (QString *)&stack0xffffffffffffff98;
  QLocale::toString(local_60,text,puVar1,local_80,local_78,
                    *(undefined8 *)&in_RDI->m_model->m_calendar,local_60);
  QAbstractButton::setText((QAbstractButton *)CONCAT44(iVar5,iVar2),text);
  QString::~QString((QString *)0x51d264);
  QLocale::~QLocale((QLocale *)text);
  updateCurrentPage(this_00,in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarWidgetPrivate::_q_yearEditingFinished()
{
    Q_Q(QCalendarWidget);
    yearEdit->hide();
    q->setFocusPolicy(oldFocusPolicy);
    qApp->removeEventFilter(q);
    spaceHolder->changeSize(0, 0);
    yearButton->show();
    QDate currentDate = getCurrentDate();
    int newYear = q->locale().toInt(yearEdit->text());
    currentDate = currentDate.addYears(newYear - currentDate.year(m_model->m_calendar), m_model->m_calendar);
    yearButton->setText(q->locale().toString(currentDate, u"yyyy", m_model->m_calendar));
    updateCurrentPage(currentDate);
}